

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk6c(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk6c *peVar4;
  envy_bios_power_unk6c_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk6c *unk6c;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk6c;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk6c.version);
    if ((bios->power).unk6c.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk6c.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk6c.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk6c.entriesnum);
      (bios->power).unk6c.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk6c_entry *)malloc((ulong)(bios->power).unk6c.entriesnum << 2);
      (bios->power).unk6c.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk6c.entriesnum; data = data + 1) {
        (bios->power).unk6c.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk6c.hlen + data * (bios->power).unk6c.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown VOLTAGE DEVICE table version 0x%x\n",
              (ulong)(bios->power).unk6c.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk6c(struct envy_bios *bios) {
	struct envy_bios_power_unk6c *unk6c = &bios->power.unk6c;
	int i, err = 0;

	if (!unk6c->offset)
		return -EINVAL;

	bios_u8(bios, unk6c->offset + 0x0, &unk6c->version);
	switch(unk6c->version) {
	case 0x10:
		err |= bios_u8(bios, unk6c->offset + 0x1, &unk6c->hlen);
		err |= bios_u8(bios, unk6c->offset + 0x2, &unk6c->rlen);
		err |= bios_u8(bios, unk6c->offset + 0x3, &unk6c->entriesnum);
		unk6c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown VOLTAGE DEVICE table version 0x%x\n", unk6c->version);
		return -EINVAL;
	};

	err = 0;
	unk6c->entries = malloc(unk6c->entriesnum * sizeof(struct envy_bios_power_unk6c_entry));
	for (i = 0; i < unk6c->entriesnum; i++) {
		uint32_t data = unk6c->offset + unk6c->hlen + i * unk6c->rlen;

		unk6c->entries[i].offset = data;
	}

	return 0;
}